

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O1

int lre_is_space(int c)

{
  long lVar1;
  
  lVar1 = 1;
  while( true ) {
    if (c < (int)(uint)*(ushort *)(&UNK_0018119e + lVar1 * 4)) {
      return 0;
    }
    if (c < (int)(uint)char_range_s[lVar1 * 2]) break;
    lVar1 = lVar1 + 1;
    if (lVar1 == 0xb) {
      return 0;
    }
  }
  return 1;
}

Assistant:

BOOL lre_is_space(int c)
{
    int i, n, low, high;
    n = (countof(char_range_s) - 1) / 2;
    for(i = 0; i < n; i++) {
        low = char_range_s[2 * i + 1];
        if (c < low)
            return FALSE;
        high = char_range_s[2 * i + 2];
        if (c < high)
            return TRUE;
    }
    return FALSE;
}